

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.h
# Opt level: O0

void __thiscall
cppcms::cache_interface::store_data<mydata>
          (cache_interface *this,string *key,mydata *data,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *triggers,int timeout,bool notriggers)

{
  int in_ECX;
  string *in_RSI;
  string *in_RDI;
  undefined1 in_R8B;
  byte in_R9B;
  string *in_stack_00000008;
  serializable_base *in_stack_00000010;
  string buffer;
  string local_48 [35];
  byte local_25;
  bool local_24;
  int local_20;
  string *local_10;
  
  local_25 = in_R9B & 1;
  local_10 = in_RSI;
  local_20 = in_ECX;
  local_24 = (bool)in_R8B;
  std::__cxx11::string::string(local_48);
  serialization_traits<mydata,_void>::save(in_stack_00000010,in_stack_00000008);
  cppcms::cache_interface::store(in_RDI,local_10,(set *)local_48,local_20,local_24);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void store_data(std::string const &key,Serializable const &data,
				std::set<std::string> const &triggers=std::set<std::string>(),
				int timeout=-1,bool notriggers=false)
		{
			std::string buffer;
			serialization_traits<Serializable>::save(data,buffer);
			store(key,buffer,triggers,timeout,notriggers);
		}